

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::CopyImage::SmokeTest::copyAndVerify(SmokeTest *this,testCase *test_case,GLubyte *src_pixels)

{
  ostringstream *poVar1;
  GLuint GVar2;
  GLenum GVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *this_00;
  size_t siglen;
  uchar *tbs;
  size_t tbslen;
  bool bVar8;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  if (this->m_rb_name == 0) {
    GVar3 = test_case->m_target;
    GVar2 = this->m_src_tex_name;
  }
  else {
    (**(code **)(lVar7 + 0x310))(this->m_src_tex_name,0xde1,0);
    GVar2 = this->m_rb_name;
    GVar3 = test_case->m_target;
  }
  tbslen = 0;
  tbs = (uchar *)0x0;
  siglen = 0;
  (**(code **)(lVar7 + 0x310))(GVar2,GVar3,0);
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 == 0) {
    iVar6 = verify(this,(EVP_PKEY_CTX *)test_case,src_pixels,siglen,tbs,tbslen);
    bVar4 = (byte)iVar6;
  }
  else {
    bVar4 = 0;
  }
  bVar8 = (bool)(iVar5 == 0 & bVar4);
  if (bVar8 == false) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Failure. Target: ",0x11);
    local_1d0.m_value = test_case->m_target;
    local_1d0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Format: ",10);
    local_1c0.m_value = test_case->m_internal_format;
    local_1c0.m_getName = glu::getInternalFormatParameterName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (iVar5 != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Failed due to error: ",0x15);
      local_1d0.m_getName = glu::getErrorName;
      local_1d0.m_value = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Copy operation failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0xf83);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return bVar8;
}

Assistant:

bool SmokeTest::copyAndVerify(const testCase& test_case, const GLubyte* src_pixels)
{
	GLenum			 error  = GL_NO_ERROR;
	const Functions& gl		= m_context.getRenderContext().getFunctions();
	bool			 result = false;

	/* Copy and verification */
	{
		if (0 == m_rb_name)
		{
			GLuint height = m_height;

			if ((GL_TEXTURE_1D == test_case.m_target) || (GL_TEXTURE_1D_ARRAY == test_case.m_target))
			{
				height = 1;
			}

			gl.copyImageSubData(m_src_tex_name, test_case.m_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
								0 /* srcZ */, m_dst_tex_name, test_case.m_target, 0 /* dstLevel */, 0 /* dstX */,
								0 /* dstY */, 0 /* dstZ */, m_width, height, m_depth);
		}
		else /* Copy from src to rb and from rb to dst */
		{
			/* Src and rb shares differs only on target */
			gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
								0 /* srcZ */, m_rb_name, test_case.m_target, 0 /* dstLevel */, 0 /* dstX */,
								0 /* dstY */, 0 /* dstZ */, m_width, m_height, m_depth);

			gl.copyImageSubData(m_rb_name, test_case.m_target, 0 /* dstLevel */, 0 /* dstX */, 0 /* dstY */,
								0 /* dstZ */, m_dst_tex_name, GL_TEXTURE_2D, 0 /* dstLevel */, 0 /* dstX */,
								0 /* dstY */, 0 /* dstZ */, m_width, m_height, m_depth);
		}

		/* Verify generated error */
		error = gl.getError();

		if (GL_NO_ERROR == error)
		{
			/* Verify copy results */
			result = verify(test_case, src_pixels);
		}

		if ((GL_NO_ERROR != error) || (false == result))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure. Target: " << glu::getTextureTargetStr(test_case.m_target)
				<< ". Format: " << glu::getInternalFormatParameterStr(test_case.m_internal_format)
				<< tcu::TestLog::EndMessage;

			if (GL_NO_ERROR != error)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "Failed due to error: " << glu::getErrorStr(error)
													<< tcu::TestLog::EndMessage;

				TCU_FAIL("Copy operation failed");
			}

			return false;
		}
	}

	return true;
}